

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9_create_function(jx9_vm *pVm,char *zName,
                       _func_int_jx9_context_ptr_int_jx9_value_ptr_ptr *xFunc,void *pUserData)

{
  char cVar1;
  sxu32 sVar2;
  sxi32 sVar3;
  ushort **ppuVar4;
  ulong uVar5;
  ulong uVar6;
  char *pcVar7;
  char *pcVar8;
  SyString local_40;
  
  sVar3 = -0x18;
  if ((pVm != (jx9_vm *)0x0) && (pVm->nMagic != 0xdead2bad)) {
    sVar2 = SyStrlen(zName);
    uVar5 = (ulong)sVar2;
    pcVar7 = zName + uVar5;
    while (((local_40.nByte = (uint)uVar5, local_40.zString = pcVar7, pcVar8 = pcVar7,
            local_40.nByte != 0 &&
            (cVar1 = *zName, local_40.zString = zName, pcVar8 = zName,
            (ulong)(long)cVar1 < 0xffffffffffffffc0)) &&
           (ppuVar4 = __ctype_b_loc(), (*(byte *)((long)*ppuVar4 + (long)cVar1 * 2 + 1) & 0x20) != 0
           ))) {
      zName = zName + 1;
      uVar5 = uVar5 - 1;
    }
    do {
      uVar6 = uVar5;
      if (uVar6 == 0) {
        return -0x18;
      }
      cVar1 = pcVar8[uVar6 - 1];
    } while (((ulong)(long)cVar1 < 0xffffffffffffffc0) &&
            (ppuVar4 = __ctype_b_loc(), uVar5 = uVar6 - 1,
            (*(byte *)((long)*ppuVar4 + (long)cVar1 * 2 + 1) & 0x20) != 0));
    local_40.nByte = (uint)uVar6;
    if (xFunc != (_func_int_jx9_context_ptr_int_jx9_value_ptr_ptr *)0x0) {
      sVar3 = jx9VmInstallForeignFunction(pVm,&local_40,xFunc,pUserData);
    }
  }
  return sVar3;
}

Assistant:

JX9_PRIVATE int jx9_create_function(jx9_vm *pVm, const char *zName, int (*xFunc)(jx9_context *, int, jx9_value **), void *pUserData)
{
	SyString sName;
	int rc;
	/* Ticket 1433-002: NULL VM is harmless operation */
	if ( JX9_VM_MISUSE(pVm) ){
		return JX9_CORRUPT;
	}
	SyStringInitFromBuf(&sName, zName, SyStrlen(zName));
	/* Remove leading and trailing white spaces */
	SyStringFullTrim(&sName);
	/* Ticket 1433-003: NULL values are not allowed */
	if( sName.nByte < 1 || xFunc == 0 ){
		return JX9_CORRUPT;
	}
#if defined(JX9_ENABLE_THREADS)
	 /* Acquire VM mutex */
	 SyMutexEnter(sJx9MPGlobal.pMutexMethods, pVm->pMutex); /* NO-OP if sJx9MPGlobal.nThreadingLevel != JX9_THREAD_LEVEL_MULTI */
	 if( sJx9MPGlobal.nThreadingLevel > JX9_THREAD_LEVEL_SINGLE && 
		 JX9_THRD_VM_RELEASE(pVm) ){
			 return JX9_ABORT; /* Another thread have released this instance */
	 }
#endif
	/* Install the foreign function */
	rc = jx9VmInstallForeignFunction(&(*pVm), &sName, xFunc, pUserData); 
#if defined(JX9_ENABLE_THREADS)
	 /* Leave VM mutex */
	 SyMutexLeave(sJx9MPGlobal.pMutexMethods, pVm->pMutex); /* NO-OP if sJx9MPGlobal.nThreadingLevel != JX9_THREAD_LEVEL_MULTI */
#endif
	return rc;
}